

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase170::run(TestCase170 *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  bool bVar3;
  TransformPromiseNodeBase *pTVar4;
  String result2;
  Own<kj::_::PromiseNode> local_f0;
  String result;
  Own<kj::_::PromiseNode> local_c8;
  Own<kj::_::PromiseNode> local_b8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:179:11),_unsigned_long>
  promise;
  Own<kj::_::PromiseNode> local_98;
  Own<kj::_::PromiseNode> local_88;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[1])(&pipe);
  (**((pipe.ends[0].ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_f0,&(pipe.ends[0].ptr)->super_AsyncOutputStream,"foo",3);
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_f0,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:177:53),_kj::_::PropagateException>
             ::anon_class_16_2_40a49b79_for_func::operator());
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041ea88;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&pipe;
  pTVar4[1].dependency.disposer = (Disposer *)receiveBuffer1;
  result.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::TestCase170::run()::$_0,kj::_::PropagateException>>
                ::instance;
  result.content.size_ = (size_t)pTVar4;
  _::maybeChain<unsigned_long>(&local_98,(Promise<unsigned_long> *)&result);
  pPVar2 = local_98.ptr;
  result2.content.ptr = (char *)local_98.disposer;
  local_98.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_98);
  local_c8.disposer = local_98.disposer;
  local_c8.ptr = pPVar2;
  result2.content.size_ = 0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_c8,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:179:11),_kj::_::PropagateException>
             ::anon_class_8_1_8ba005cc_for_func::operator());
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041eb10;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)receiveBuffer1;
  result.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_1,kj::_::PropagateException>>
                ::instance;
  result2.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_1,kj::_::PropagateException>>
                ::instance;
  result.content.size_ = 0;
  promise.super_PromiseBase.node.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_1,kj::_::PropagateException>>
        ::instance;
  result2.content.size_ = 0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)pTVar4;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
  Own<kj::_::PromiseNode>::dispose(&local_c8);
  Own<kj::_::PromiseNode>::dispose(&local_f0);
  (**((pipe.ends[1].ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_88,&(pipe.ends[1].ptr)->super_AsyncOutputStream,"bar",3);
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_88,
             _::
             TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:184:58),_kj::_::PropagateException>
             ::anon_class_16_2_40a49b7a_for_func::operator());
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041eb98;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&pipe;
  pTVar4[1].dependency.disposer = (Disposer *)receiveBuffer2;
  result2.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::TestCase170::run()::$_2,kj::_::PropagateException>>
                ::instance;
  result2.content.size_ = (size_t)pTVar4;
  _::maybeChain<unsigned_long>(&local_c8,(Promise<unsigned_long> *)&result2);
  pPVar2 = local_c8.ptr;
  pDVar1 = local_c8.disposer;
  local_98.disposer = local_c8.disposer;
  local_c8.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_c8);
  local_b8.disposer = pDVar1;
  local_b8.ptr = pPVar2;
  local_98.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_98);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result2);
  pTVar4 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar4,&local_b8,
             _::
             TransformPromiseNode<kj::String,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:186:11),_kj::_::PropagateException>
             ::anon_class_8_1_8ba005cd_for_func::operator());
  (pTVar4->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041ec20;
  pTVar4[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)receiveBuffer2;
  result2.content.ptr =
       (char *)&_::
                HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_3,kj::_::PropagateException>>
                ::instance;
  local_98.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_3,kj::_::PropagateException>>
        ::instance;
  result2.content.size_ = 0;
  local_f0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::String,unsigned_long,kj::(anonymous_namespace)::TestCase170::run()::$_3,kj::_::PropagateException>>
        ::instance;
  local_98.ptr = (PromiseNode *)0x0;
  local_f0.ptr = (PromiseNode *)pTVar4;
  Own<kj::_::PromiseNode>::dispose(&local_98);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result2);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&local_f0);
  Own<kj::_::PromiseNode>::dispose(&local_f0);
  Own<kj::_::PromiseNode>::dispose(&local_b8);
  Own<kj::_::PromiseNode>::dispose(&local_88);
  Promise<kj::String>::wait((Promise<kj::String> *)&result2,&promise);
  bVar3 = kj::operator==("foo",&result);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[37],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xc1,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (result)\", \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",(char (*) [4])0x357ec7,
               &result);
  }
  bVar3 = kj::operator==("bar",&result2);
  if (!bVar3 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[38],char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xc2,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (result2)\", \"bar\", result2",
               (char (*) [38])"failed: expected (\"bar\") == (result2)",(char (*) [4])0x33b5a1,
               &result2);
  }
  Array<char>::~Array(&result2.content);
  Array<char>::~Array(&result.content);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  TwoWayPipe::~TwoWayPipe(&pipe);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4];
  char receiveBuffer2[4];

  auto promise = pipe.ends[0]->write("foo", 3).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar", 3).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}